

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O3

bool ParseFixedPoint(string_view val,int decimals,int64_t *amount_out)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  char *pcVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  long in_FS_OFFSET;
  bool bVar16;
  bool bVar17;
  
  pcVar7 = val._M_str;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar16 = false;
  uVar8 = (uint)val._M_len;
  if ((int)uVar8 < 1) {
    uVar11 = 0;
  }
  else {
    bVar16 = *pcVar7 == '-';
    uVar11 = (uint)bVar16;
  }
  if ((int)uVar8 <= (int)uVar11) goto LAB_00158266;
  uVar14 = (ulong)uVar11;
  if (pcVar7[uVar14] == '0') {
    uVar11 = uVar11 + 1;
    lVar9 = 0;
    iVar10 = 0;
LAB_00157ff8:
    if (((int)uVar11 < (int)uVar8) && (lVar5 = (long)(int)uVar11, pcVar7[lVar5] == '.')) {
      if ((int)uVar8 <= (int)((long)(int)uVar11 + 1)) goto LAB_00158266;
      uVar4 = 0;
      if (9 < (byte)(pcVar7[(long)(int)uVar11 + 1] - 0x30U)) goto LAB_00158268;
      uVar6 = ~uVar11 + uVar8;
      do {
        bVar1 = pcVar7[lVar5 + 1];
        lVar5 = lVar5 + 1;
        if (9 < (byte)(bVar1 - 0x30)) {
          uVar11 = (uint)lVar5;
          uVar6 = (uint)uVar4;
          break;
        }
        if (bVar1 == 0x30) {
          iVar10 = iVar10 + 1;
        }
        else {
          if (-1 < iVar10) {
            iVar10 = iVar10 + 1;
            do {
              if (99999999999999999 < lVar9) goto LAB_00158266;
              lVar9 = lVar9 * 10;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          lVar9 = lVar9 + (ulong)bVar1 + -0x30;
          iVar10 = 0;
        }
        uVar3 = (uint)uVar4 + 1;
        uVar4 = (ulong)uVar3;
        uVar11 = uVar8;
      } while (uVar3 != uVar6);
      uVar4 = (ulong)uVar6;
    }
    else {
      uVar4 = 0;
    }
    if (((int)uVar11 < (int)uVar8) && ((byte)(pcVar7[(int)uVar11] | 0x20U) == 0x65)) {
      uVar14 = (long)(int)uVar11 + 1;
      if ((int)(uint)uVar14 < (int)uVar8) {
        uVar6 = uVar11 + 2;
        if (pcVar7[uVar14] == '+') {
          bVar17 = false;
        }
        else {
          bVar17 = pcVar7[uVar14] == '-';
          if (!bVar17) {
            uVar6 = (uint)uVar14;
          }
        }
        uVar14 = (ulong)uVar6;
      }
      else {
        bVar17 = false;
      }
      iVar13 = (int)uVar14;
      if ((iVar13 < (int)uVar8) && (lVar5 = (long)iVar13, (byte)(pcVar7[lVar5] - 0x30U) < 10)) {
        lVar12 = 0;
        lVar15 = 0;
        do {
          if (9 < (byte)(pcVar7[lVar12 + lVar5] - 0x30U)) {
            uVar11 = iVar13 + (int)lVar12;
            goto LAB_0015814f;
          }
          if (99999999999999999 < lVar15) goto LAB_00158266;
          lVar15 = lVar15 * 10 + -0x30 + (ulong)(byte)pcVar7[lVar12 + lVar5];
          lVar12 = lVar12 + 1;
        } while ((int)uVar8 - lVar5 != lVar12);
LAB_00158158:
        lVar5 = -lVar15;
        if (!bVar17) {
          lVar5 = lVar15;
        }
        goto LAB_00158165;
      }
    }
    else {
      lVar15 = 0;
      bVar17 = false;
LAB_0015814f:
      if (uVar11 == uVar8) goto LAB_00158158;
    }
  }
  else {
    uVar4 = 0;
    if (8 < (byte)(pcVar7[uVar14] - 0x31U)) goto LAB_00158268;
    iVar10 = 0;
    lVar9 = 0;
    do {
      bVar1 = pcVar7[uVar14];
      if (9 < (byte)(bVar1 - 0x30)) {
        uVar11 = (uint)uVar14;
        goto LAB_00157ff8;
      }
      if (bVar1 == 0x30) {
        iVar10 = iVar10 + 1;
      }
      else {
        if (-1 < iVar10) {
          iVar10 = iVar10 + 1;
          do {
            if (99999999999999999 < lVar9) goto LAB_00158266;
            lVar9 = lVar9 * 10;
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
        }
        lVar9 = lVar9 + (ulong)bVar1 + -0x30;
        iVar10 = 0;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar8);
    lVar5 = 0;
LAB_00158165:
    uVar14 = (((long)decimals + (long)iVar10) - uVar4) + lVar5;
    if (uVar14 < 0x12) {
      lVar5 = -lVar9;
      if (!bVar16) {
        lVar5 = lVar9;
      }
      if (uVar14 != 0) {
        uVar4 = 0;
        do {
          if (lVar5 + 0xfe9cba87a2760000U < 0xfd39750f44ec0001) goto LAB_00158266;
          lVar5 = lVar5 * 10;
          uVar4 = uVar4 + 1;
        } while (uVar4 < uVar14);
      }
      if (0xe43e9298b1380000 < lVar5 + 0xf21f494c589c0000U) {
        uVar4 = 1;
        if (amount_out != (int64_t *)0x0) {
          *amount_out = lVar5;
        }
        goto LAB_00158268;
      }
    }
  }
LAB_00158266:
  uVar4 = 0;
LAB_00158268:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return SUB81(uVar4,0);
}

Assistant:

bool ParseFixedPoint(std::string_view val, int decimals, int64_t *amount_out)
{
    int64_t mantissa = 0;
    int64_t exponent = 0;
    int mantissa_tzeros = 0;
    bool mantissa_sign = false;
    bool exponent_sign = false;
    int ptr = 0;
    int end = val.size();
    int point_ofs = 0;

    if (ptr < end && val[ptr] == '-') {
        mantissa_sign = true;
        ++ptr;
    }
    if (ptr < end)
    {
        if (val[ptr] == '0') {
            /* pass single 0 */
            ++ptr;
        } else if (val[ptr] >= '1' && val[ptr] <= '9') {
            while (ptr < end && IsDigit(val[ptr])) {
                if (!ProcessMantissaDigit(val[ptr], mantissa, mantissa_tzeros))
                    return false; /* overflow */
                ++ptr;
            }
        } else return false; /* missing expected digit */
    } else return false; /* empty string or loose '-' */
    if (ptr < end && val[ptr] == '.')
    {
        ++ptr;
        if (ptr < end && IsDigit(val[ptr]))
        {
            while (ptr < end && IsDigit(val[ptr])) {
                if (!ProcessMantissaDigit(val[ptr], mantissa, mantissa_tzeros))
                    return false; /* overflow */
                ++ptr;
                ++point_ofs;
            }
        } else return false; /* missing expected digit */
    }
    if (ptr < end && (val[ptr] == 'e' || val[ptr] == 'E'))
    {
        ++ptr;
        if (ptr < end && val[ptr] == '+')
            ++ptr;
        else if (ptr < end && val[ptr] == '-') {
            exponent_sign = true;
            ++ptr;
        }
        if (ptr < end && IsDigit(val[ptr])) {
            while (ptr < end && IsDigit(val[ptr])) {
                if (exponent > (UPPER_BOUND / 10LL))
                    return false; /* overflow */
                exponent = exponent * 10 + val[ptr] - '0';
                ++ptr;
            }
        } else return false; /* missing expected digit */
    }
    if (ptr != end)
        return false; /* trailing garbage */

    /* finalize exponent */
    if (exponent_sign)
        exponent = -exponent;
    exponent = exponent - point_ofs + mantissa_tzeros;

    /* finalize mantissa */
    if (mantissa_sign)
        mantissa = -mantissa;

    /* convert to one 64-bit fixed-point value */
    exponent += decimals;
    if (exponent < 0)
        return false; /* cannot represent values smaller than 10^-decimals */
    if (exponent >= 18)
        return false; /* cannot represent values larger than or equal to 10^(18-decimals) */

    for (int i=0; i < exponent; ++i) {
        if (mantissa > (UPPER_BOUND / 10LL) || mantissa < -(UPPER_BOUND / 10LL))
            return false; /* overflow */
        mantissa *= 10;
    }
    if (mantissa > UPPER_BOUND || mantissa < -UPPER_BOUND)
        return false; /* overflow */

    if (amount_out)
        *amount_out = mantissa;

    return true;
}